

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileHdrWrapper.cpp
# Opt level: O2

QString * FileHdrWrapper::translateMachine(DWORD val)

{
  iterator iVar1;
  QArrayDataPointer<char16_t> *other;
  QArrayDataPointer<char16_t> *in_RDI;
  key_type_conflict2 local_14;
  
  if (s_machine._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    initMachine();
  }
  iVar1 = std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_QString>,_std::_Select1st<std::pair<const_unsigned_int,_QString>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
          ::find(&s_machine._M_t,&local_14);
  if ((_Rb_tree_header *)iVar1._M_node == &s_machine._M_t._M_impl.super__Rb_tree_header) {
    QString::QString((QString *)in_RDI,"");
  }
  else {
    other = &std::
             map<unsigned_int,_QString,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_QString>_>_>
             ::operator[](&s_machine,&local_14)->d;
    QArrayDataPointer<char16_t>::QArrayDataPointer(in_RDI,other);
  }
  return (QString *)in_RDI;
}

Assistant:

QString FileHdrWrapper::translateMachine(DWORD val)
{
    if (s_machine.size() == 0) 
        initMachine();

    if (s_machine.find(val) == s_machine.end()) return "";
    return s_machine[val];
}